

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall runtime::VirtualMachine::MakeObj(VirtualMachine *this)

{
  element_type *peVar1;
  element_type *peVar2;
  size_t __n;
  const_reference pvVar3;
  size_type __n_00;
  Variable VVar4;
  string local_80;
  VariableType local_60;
  anon_union_8_6_52c89740_for_Variable_1 local_58;
  const_reference local_50;
  const_reference local_48;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_40;
  allocator<char> local_31;
  
  __n = getByteCodeParameter(this);
  peVar1 = (this->file).super___shared_ptr<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (__n < (ulong)(((long)(peVar1->objects).
                           super__Vector_base<bytecode::ObjectConstructor,_std::allocator<bytecode::ObjectConstructor>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(peVar1->objects).
                          super__Vector_base<bytecode::ObjectConstructor,_std::allocator<bytecode::ObjectConstructor>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
    pvVar3 = std::vector<bytecode::ObjectConstructor,_std::allocator<bytecode::ObjectConstructor>_>
             ::at(&peVar1->objects,__n);
    local_40 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)Heap::NewObject(&this->heap);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::clear(local_40);
    __n_00 = (long)(pvVar3->keys).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pvVar3->keys).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    local_48 = pvVar3;
    while (__n_00 = __n_00 - 1, __n_00 != 0xffffffffffffffff) {
      local_50 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at(&local_48->keys,__n_00);
      VVar4 = popOpStack(this);
      std::__cxx11::string::string((string *)&local_80,(string *)local_50);
      local_60 = VVar4.type;
      local_58.integerValue = VVar4.field_1.integerValue;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,runtime::Variable>,std::allocator<std::pair<std::__cxx11::string_const,runtime::Variable>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<std::__cxx11::string,runtime::Variable>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,runtime::Variable>,std::allocator<std::pair<std::__cxx11::string_const,runtime::Variable>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)local_40,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
    pushObject(this,(Object *)local_40);
    peVar2 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    peVar2->programCounter = peVar2->programCounter + 1;
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"Index out of bounds in MakeObj",&local_31);
  panic(this,&local_80);
}

Assistant:

void runtime::VirtualMachine::MakeObj() {

  std::size_t objIndex = this->getByteCodeParameter();

  if (objIndex >= this->file->objects.size()) {
    this->panic("Index out of bounds in MakeObj");
    return;
  }

  const auto& objProto = this->file->objects.at(objIndex);

  auto ret = this->heap.NewObject();
  ret->properties.clear();

  for (std::size_t i = objProto.keys.size(); i-- > 0;) {
    const std::string & key = objProto.keys.at(i);
    const Variable value = this->popOpStack();
    ret->properties.insert(std::make_pair(key, value));
  }

  this->pushObject(ret);
  this->advance();
}